

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::Expression::bindRValue
          (Expression *this,Type *lhs,ExpressionSyntax *rhs,SourceRange assignmentRange,
          ASTContext *context,bitmask<slang::ast::ASTFlags> extraFlags)

{
  Compilation *compilation;
  bool bVar1;
  Type *type;
  Type *pTVar2;
  InstanceSymbolBase *pIVar3;
  Expression *pEVar4;
  SourceLocation SVar5;
  SourceLocation this_00;
  SourceRange assignmentRange_00;
  SourceRange assignmentRange_01;
  ASTContext ctx;
  bitmask<slang::ast::AssignFlags> *in_stack_ffffffffffffff80;
  ASTContext local_68;
  
  this_00 = assignmentRange.endLoc;
  SVar5 = assignmentRange.startLoc;
  compilation = (Compilation *)**(undefined8 **)this_00;
  ASTContext::resetFlags(&local_68,(ASTContext *)this_00,(bitmask<slang::ast::ASTFlags>)context);
  bVar1 = Type::isVirtualInterfaceOrArray((Type *)this);
  if (bVar1) {
    type = (Type *)tryBindInterfaceRef(&local_68,(ExpressionSyntax *)lhs,false);
    pTVar2 = type;
    if (type != (Type *)0x0) {
      if (((ulong)rhs & 0xfffffff) == 0) {
        rhs = (ExpressionSyntax *)(type->super_Symbol).parentScope;
        SVar5 = (SourceLocation)(type->super_Symbol).nextInScope;
      }
      assignmentRange_00.endLoc = (SourceLocation)0x0;
      assignmentRange_00.startLoc = SVar5;
      pTVar2 = (Type *)convertAssignment((Expression *)&local_68,(ASTContext *)this,type,
                                         (Expression *)rhs,assignmentRange_00,(Expression **)0x0,
                                         in_stack_ffffffffffffff80);
    }
    if (type != (Type *)0x0) {
      return (Expression *)pTVar2;
    }
  }
  pIVar3 = ASTContext::getInstance((ASTContext *)this_00);
  if ((pIVar3 == (InstanceSymbolBase *)0x0) || ((pIVar3->arrayPath)._M_extent._M_extent_value == 0))
  {
    context = (ASTContext *)((ulong)context | 0x80);
  }
  pTVar2 = (Type *)create(compilation,(ExpressionSyntax *)lhs,&local_68,
                          (bitmask<slang::ast::ASTFlags>)context,(Type *)this);
  if (((ulong)rhs & 0xfffffff) == 0) {
    rhs = (ExpressionSyntax *)(pTVar2->super_Symbol).parentScope;
    SVar5 = (SourceLocation)(pTVar2->super_Symbol).nextInScope;
  }
  assignmentRange_01.endLoc = (SourceLocation)0x0;
  assignmentRange_01.startLoc = SVar5;
  pEVar4 = convertAssignment((Expression *)&local_68,(ASTContext *)this,pTVar2,(Expression *)rhs,
                             assignmentRange_01,(Expression **)0x0,in_stack_ffffffffffffff80);
  return pEVar4;
}

Assistant:

const Expression& Expression::bindRValue(const Type& lhs, const ExpressionSyntax& rhs,
                                         SourceRange assignmentRange, const ASTContext& context,
                                         bitmask<ASTFlags> extraFlags) {
    Compilation& comp = context.getCompilation();

    ASTContext ctx = context.resetFlags(extraFlags);
    if (lhs.isVirtualInterfaceOrArray()) {
        if (auto ref = tryBindInterfaceRef(ctx, rhs, /* isInterfacePort */ false)) {
            if (!assignmentRange.start())
                assignmentRange = ref->sourceRange;
            return convertAssignment(ctx, lhs, *ref, assignmentRange);
        }
    }

    auto instance = context.getInstance();
    if (!instance || instance->arrayPath.empty())
        extraFlags |= ASTFlags::StreamingAllowed;

    Expression& expr = create(comp, rhs, ctx, extraFlags, &lhs);
    if (!assignmentRange.start())
        assignmentRange = expr.sourceRange;

    return convertAssignment(ctx, lhs, expr, assignmentRange);
}